

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__get16le(stbi__context *s)

{
  byte bVar1;
  byte bVar2;
  int z;
  stbi__context *in_stack_ffffffffffffffe8;
  
  bVar1 = stbi__get8(in_stack_ffffffffffffffe8);
  bVar2 = stbi__get8(in_stack_ffffffffffffffe8);
  return (uint)bVar1 + (uint)bVar2 * 0x100;
}

Assistant:

static int stbi__get16le(stbi__context *s)
{
   int z = stbi__get8(s);
   return z + (stbi__get8(s) << 8);
}